

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

FieldGenerator *
google::protobuf::compiler::cpp::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Options *options)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  MessageOneofFieldGenerator *this;
  
  if (*(int *)(field + 0x4c) == 3) {
    TVar4 = FieldDescriptor::type(field);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
    if (iVar1 == 8) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,options);
    }
    else if (iVar1 == 9) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
                ((RepeatedStringFieldGenerator *)this,field,options);
    }
    else if (iVar1 == 10) {
      bVar3 = FieldDescriptor::is_map(field);
      this = (MessageOneofFieldGenerator *)operator_new(0x50);
      if (bVar3) {
        MapFieldGenerator::MapFieldGenerator((MapFieldGenerator *)this,field,options);
      }
      else {
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,field,options);
      }
    }
    else {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,options);
    }
  }
  else {
    lVar2 = *(long *)(field + 0x60);
    TVar4 = FieldDescriptor::type(field);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
    if (lVar2 == 0) {
      if (iVar1 == 8) {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,options);
      }
      else if (iVar1 == 9) {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        StringFieldGenerator::StringFieldGenerator((StringFieldGenerator *)this,field,options);
      }
      else if (iVar1 == 10) {
        this = (MessageOneofFieldGenerator *)operator_new(0x50);
        MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,options);
      }
      else {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)this,field,options);
      }
    }
    else if (iVar1 == 8) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      EnumOneofFieldGenerator::EnumOneofFieldGenerator
                ((EnumOneofFieldGenerator *)this,field,options);
    }
    else if (iVar1 == 9) {
      this = (MessageOneofFieldGenerator *)operator_new(0x50);
      StringOneofFieldGenerator::StringOneofFieldGenerator
                ((StringOneofFieldGenerator *)this,field,options);
    }
    else if (iVar1 == 10) {
      this = (MessageOneofFieldGenerator *)operator_new(0x58);
      MessageOneofFieldGenerator::MessageOneofFieldGenerator(this,field,options);
    }
    else {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)this,field,options);
    }
  }
  return (FieldGenerator *)this;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
                                                 const Options& options) {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (field->is_map()) {
          return new MapFieldGenerator(field, options);
        } else {
          return new RepeatedMessageFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // RepeatedStringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new RepeatedStringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, options);
    }
  } else if (field->containing_oneof()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageOneofFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringOneofFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringOneofFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumOneofFieldGenerator(field, options);
      default:
        return new PrimitiveOneofFieldGenerator(field, options);
    }
  } else {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumFieldGenerator(field, options);
      default:
        return new PrimitiveFieldGenerator(field, options);
    }
  }
}